

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void monkilled(monst *mdef,char *fltxt,int how)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  boolean kenny;
  boolean be_sad;
  int how_local;
  char *fltxt_local;
  monst *mdef_local;
  
  bVar8 = false;
  pcVar4 = m_monnam(mdef);
  iVar3 = strcmp(pcVar4,"Kenny");
  if (mdef->wormno == '\0') {
    bVar1 = viz_array[mdef->my][mdef->mx] & 2;
  }
  else {
    bVar1 = worm_known(level,mdef);
  }
  if ((bVar1 == 0) || (fltxt == (char *)0x0)) {
    bVar8 = mdef->mtame != '\0';
  }
  else {
    pcVar4 = Monnam(mdef);
    bVar7 = true;
    if ((mdef->data->mlet != '7') &&
       ((bVar7 = true, (mdef->data->mflags2 & 2) == 0 && (bVar7 = true, mdef->data->mlet != '\x16'))
       )) {
      bVar7 = mdef->data == mons + 0x33;
    }
    pcVar6 = "killed";
    if (bVar7) {
      pcVar6 = "destroyed";
    }
    pcVar5 = "";
    if (*fltxt != '\0') {
      pcVar5 = " by the ";
    }
    pline("%s is %s%s%s!",pcVar4,pcVar6,pcVar5,fltxt);
  }
  if (((how == 0x1a) || (how == -0xf2)) || (how == 5)) {
    mondead_helper(mdef,how);
  }
  else {
    mondied(mdef);
  }
  if (mdef->data == mons + 0x143) {
    cthulhu_dies(mdef);
  }
  if ((bVar8) && (mdef->mhp < 1)) {
    if ((iVar3 == 0) ||
       ((((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))) &&
        (iVar3 = rn2(4), iVar3 == 0)))) {
      verbalize("Oh my god, they killed Kenny!");
      verbalize("You bastards!");
    }
    else {
      bVar8 = false;
      if (u.uprops[0x23].intrinsic != 0) {
        bVar8 = true;
        if ((u.uprops[0x24].extrinsic == 0) && (bVar8 = false, u.umonnum != u.umonster)) {
          bVar2 = dmgtype(youmonst.data,0x24);
          bVar8 = bVar2 != '\0';
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      pcVar4 = "sad";
      if (bVar8) {
        pcVar4 = "plaid";
      }
      pline("You have a %s feeling for a moment, then it passes.",pcVar4);
    }
  }
  return;
}

Assistant:

void monkilled(struct monst *mdef, const char *fltxt, int how)
{
	boolean be_sad = FALSE;		/* true if unseen pet is killed */
	boolean kenny = !strcmp(m_monnam(mdef), "Kenny");

	if ((mdef->wormno ? worm_known(level, mdef) : cansee(mdef->mx, mdef->my))
		&& fltxt)
	    pline("%s is %s%s%s!", Monnam(mdef),
			nonliving(mdef->data) ? "destroyed" : "killed",
		    *fltxt ? " by the " : "",
		    fltxt
		 );
	else
	    be_sad = (mdef->mtame != 0);

	/* no corpses if digested or disintegrated */
	if (how == AD_DGST || how == -AD_RBRE || how == AD_DISN)
	    mondead_helper(mdef, how);
	else
	    mondied(mdef);

	if (mdef->data == &mons[PM_CTHULHU])
	    cthulhu_dies(mdef);

	if (be_sad && mdef->mhp <= 0) {
	    if (kenny || (Hallucination && !rn2(4))) {
		verbalize("Oh my god, they killed Kenny!");
		verbalize("You bastards!");
	    } else {
		pline("You have a %s feeling for a moment, then it passes.",
			(Hallucination ? "plaid" : "sad"));
	    }
	}
}